

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

VkQueue __thiscall
VulkanUtilities::VulkanLogicalDevice::GetQueue
          (VulkanLogicalDevice *this,HardwareQueueIndex queueFamilyIndex,uint32_t queueIndex)

{
  char (*Args_1) [26];
  VkQueue vkQueue;
  string msg;
  VkQueue local_30;
  string local_28;
  
  Args_1 = (char (*) [26])&local_30;
  local_30 = (VkQueue)0x0;
  (*vkGetDeviceQueue)(this->m_VkDevice,(uint)queueFamilyIndex.m_Value,0,(VkQueue *)Args_1);
  if (local_30 == (VkQueue)0x0) {
    Diligent::FormatString<char[26],char[26]>
              (&local_28,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"vkQueue != VK_NULL_HANDLE",Args_1);
    Diligent::DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x93);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  return local_30;
}

Assistant:

VkQueue VulkanLogicalDevice::GetQueue(HardwareQueueIndex queueFamilyIndex, uint32_t queueIndex)
{
    VkQueue vkQueue = VK_NULL_HANDLE;
    vkGetDeviceQueue(m_VkDevice,
                     queueFamilyIndex, // Index of the queue family to which the queue belongs
                     0,                // Index within this queue family of the queue to retrieve
                     &vkQueue);
    VERIFY_EXPR(vkQueue != VK_NULL_HANDLE);
    return vkQueue;
}